

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O0

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractTokensFromLine(ResponseBase *this,string *line)

{
  string_view replacement;
  string_view find;
  move_iterator<std::_Rb_tree_const_iterator<Token>_> __first;
  move_iterator<std::_Rb_tree_const_iterator<Token>_> __last;
  move_iterator<std::_Rb_tree_const_iterator<Token>_> this_00;
  size_t in_RDX;
  char *in_RSI;
  string *in_RDI;
  string *in_stack_00000010;
  ResponseBase *in_stack_00000018;
  set<Token,_std::less<Token>,_std::allocator<Token>_> header_tokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> std_tokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *tokens;
  _Rb_tree_const_iterator<Token> in_stack_fffffffffffffec8;
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_stack_fffffffffffffed0;
  move_iterator<std::_Rb_tree_const_iterator<Token>_> in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  string *psVar1;
  char *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff80;
  ResponseBase *in_stack_ffffffffffffff88;
  
  psVar1 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8._M_current._M_node);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8._M_current._M_node);
  find._M_str = in_stack_ffffffffffffff10;
  find._M_len = in_RDX;
  replacement._M_str = in_RSI;
  replacement._M_len = (size_t)psVar1;
  ::str::replace_all(in_RDI,find,replacement);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::set
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x1b39e2);
  extractStdTokensFromLine(in_stack_00000018,in_stack_00000010);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::begin
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
             in_stack_fffffffffffffec8._M_node);
  std::make_move_iterator<std::_Rb_tree_const_iterator<Token>>(in_stack_fffffffffffffec8);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::end
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
             in_stack_fffffffffffffec8._M_node);
  __first = std::make_move_iterator<std::_Rb_tree_const_iterator<Token>>(in_stack_fffffffffffffec8);
  std::set<Token,std::less<Token>,std::allocator<Token>>::
  insert<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            (in_stack_fffffffffffffed0,__first,in_stack_fffffffffffffed8);
  extractHeaderTokensFromLine(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::begin
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
             in_stack_fffffffffffffec8._M_node);
  __last = std::make_move_iterator<std::_Rb_tree_const_iterator<Token>>(in_stack_fffffffffffffec8);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::end
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
             in_stack_fffffffffffffec8._M_node);
  this_00 = std::make_move_iterator<std::_Rb_tree_const_iterator<Token>>(in_stack_fffffffffffffec8);
  std::set<Token,std::less<Token>,std::allocator<Token>>::
  insert<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)this_00._M_current._M_node,
             __first,__last);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::~set
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x1b3b15);
  std::set<Token,_std::less<Token>,_std::allocator<Token>_>::~set
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)0x1b3b22);
  return (set<Token,_std::less<Token>,_std::allocator<Token>_> *)in_RDI;
}

Assistant:

std::set<Token> extractTokensFromLine(std::string line) const { // TODO needs some love
        str::replace_all(line, "\\_", "_");

        std::set<Token> tokens;

        std::set<Token> std_tokens = extractStdTokensFromLine(line);
        tokens.insert(std::make_move_iterator(std_tokens.begin()), std::make_move_iterator(std_tokens.end()));

        std::set<Token> header_tokens = extractHeaderTokensFromLine(line);
        tokens.insert(std::make_move_iterator(header_tokens.begin()), std::make_move_iterator(header_tokens.end()));

        return tokens;
    }